

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex_posix.c
# Opt level: O0

void mutex_free(mutex_handle *mutex)

{
  pthread_cond_t *__cond;
  mutex_priv *priv;
  mutex_handle *mutex_local;
  
  if (mutex->priv != (void *)0x0) {
    __cond = (pthread_cond_t *)mutex->priv;
    pthread_mutex_destroy((pthread_mutex_t *)(__cond + 1));
    pthread_cond_destroy(__cond);
    free(mutex->priv);
    mutex->priv = (void *)0x0;
  }
  return;
}

Assistant:

void mutex_free(struct mutex_handle *mutex)
{
	if (mutex->priv != NULL) {
		struct mutex_priv *priv = mutex->priv;

		pthread_mutex_destroy(&priv->lock);

		pthread_cond_destroy(&priv->cond);

		free(mutex->priv);
		mutex->priv = NULL;
	}
}